

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O2

void __thiscall gimage::PNMImageIO::save(PNMImageIO *this,ImageU16 *image,char *name)

{
  int iVar1;
  IOException *this_00;
  long i;
  long lVar2;
  int j;
  long lVar3;
  long k;
  long lVar4;
  allocator local_271;
  string type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream out;
  undefined1 local_228 [24];
  int aiStack_210 [120];
  
  iVar1 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,0);
  if (((char)iVar1 != '\0') && ((image->depth | 2U) == 3)) {
    std::__cxx11::string::string((string *)&type,"P5",(allocator *)&out);
    if (image->depth == 3) {
      std::__cxx11::string::assign((char *)&type);
    }
    anon_unknown_11::writePNMHeader
              (name,type._M_dataplus._M_p,image->width,image->height,0xffff,0.0);
    std::ofstream::ofstream(&out);
    std::ios::exceptions((int)&out + (int)*(undefined8 *)(_out + -0x18));
    std::ofstream::open((char *)&out,(_Ios_Openmode)name);
    lVar4 = 0;
    while ((lVar4 < image->height && (*(int *)((long)aiStack_210 + *(long *)(_out + -0x18)) == 0)))
    {
      for (lVar2 = 0; lVar2 < image->width; lVar2 = lVar2 + 1) {
        for (lVar3 = 0; lVar3 < image->depth; lVar3 = lVar3 + 1) {
          std::streambuf::sputc((char)local_228);
          std::streambuf::sputc((char)local_228);
        }
      }
      lVar4 = lVar4 + 1;
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&out);
    std::__cxx11::string::~string((string *)&type);
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_250,name,&local_271);
  std::operator+(&type,"Can only save PNM images with depth 1 or 3 (",&local_250);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,&type,")"
                );
  gutil::IOException::IOException(this_00,(string *)&out);
  __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void PNMImageIO::save(const ImageU16 &image, const char *name) const
{
  if (!handlesFile(name, false) || (image.getDepth() != 1 && image.getDepth() != 3))
  {
    throw gutil::IOException("Can only save PNM images with depth 1 or 3 ("+std::string(name)+")");
  }

  std::string type="P5";

  if (image.getDepth() == 3)
  {
    type="P6";
  }

  writePNMHeader(name, type.c_str(), image.getWidth(), image.getHeight(),
                 65535, 0);

  try
  {
    std::ofstream out;
    out.exceptions(std::ios_base::failbit | std::ios_base::badbit);
    out.open(name, std::ios::binary|std::ios::app);

    std::streambuf *sb=out.rdbuf();

    for (long k=0; k<image.getHeight() && out.good(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        for (int j=0; j<image.getDepth(); j++)
        {
          ImageU16::store_t p=image.get(i, k, j);

          sb->sputc(static_cast<char>((p>>8)&0xff));
          sb->sputc(static_cast<char>(p&0xff));
        }
      }
    }

    out.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }
}